

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O3

TestStatus * __thiscall
vkt::shaderexecutor::
BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Vector<float,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_3,_3>,_tcu::Vector<float,_3>_>_>
::iterate(TestStatus *__return_storage_ptr__,
         BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Vector<float,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_3,_3>,_tcu::Vector<float,_3>_>_>
         *this)

{
  double *pdVar1;
  _Base_ptr p_Var2;
  ostringstream *poVar3;
  _Rb_tree_node_base *p_Var4;
  Precision PVar5;
  Samplings<vkt::shaderexecutor::InTypes<tcu::Vector<float,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  *this_00;
  size_t sVar6;
  Statement *pSVar7;
  ShaderExecutor *pSVar8;
  Variable<tcu::Vector<float,_3>_> *pVVar9;
  pointer pcVar10;
  Variable<tcu::Matrix<float,_3,_3>_> *pVVar11;
  pointer pVVar12;
  bool bVar13;
  bool bVar14;
  int iVar15;
  uint uVar16;
  undefined8 uVar17;
  long lVar18;
  long lVar19;
  IVal *pIVar20;
  IVal *pIVar21;
  string *psVar22;
  undefined8 *puVar23;
  undefined1 *puVar24;
  Vector<float,_3> *val;
  int row;
  long lVar25;
  _Base_ptr p_Var26;
  FloatFormat *pFVar27;
  TestStatus *pTVar28;
  byte bVar29;
  IVal in2;
  IVal in1;
  IVal in3;
  FuncSet funcs;
  FloatFormat highpFmt;
  Environment env;
  Outputs<vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_3,_3>,_tcu::Vector<float,_3>_>_> outputs;
  IVal reference0;
  void *outputArr [2];
  Inputs<vkt::shaderexecutor::InTypes<tcu::Vector<float,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  inputs;
  void *inputArr [4];
  ResultCollector status;
  ostringstream oss;
  deUint32 in_stack_fffffffffffffa68;
  BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Vector<float,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_3,_3>,_tcu::Vector<float,_3>_>_>
  *pBVar30;
  BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Vector<float,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_3,_3>,_tcu::Vector<float,_3>_>_>
  *pBVar31;
  undefined1 local_590 [12];
  undefined4 uStack_584;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_580;
  TestLog *local_570;
  size_t local_568;
  undefined1 local_560 [16];
  undefined1 local_550 [56];
  string local_518;
  double local_4f8;
  FloatFormat *local_4f0;
  TestStatus *local_4e8;
  undefined1 local_4e0 [12];
  YesNoMaybe YStack_4d4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4d0;
  _Rb_tree_node_base *local_4c0;
  double local_4b8;
  undefined1 local_498 [16];
  double local_488;
  double dStack_480;
  double local_478;
  long local_470;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  local_468;
  Outputs<vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_3,_3>,_tcu::Vector<float,_3>_>_>
  local_438;
  undefined1 local_408 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3f8;
  double local_3e8;
  Precision local_3e0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  *local_3d8;
  undefined4 local_3d0;
  ios_base local_398 [8];
  ios_base local_390 [264];
  pointer local_288;
  pointer local_280;
  Inputs<vkt::shaderexecutor::InTypes<tcu::Vector<float,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  local_278;
  pointer local_218;
  pointer local_210;
  pointer local_208;
  pointer local_200;
  ResultCollector local_1f8;
  undefined1 local_1a8 [376];
  
  bVar29 = 0;
  this_00 = this->m_samplings;
  pFVar27 = &(this->m_caseCtx).floatFormat;
  PVar5 = (this->m_caseCtx).precision;
  sVar6 = (this->m_caseCtx).numRandoms;
  local_4e8 = __return_storage_ptr__;
  iVar15 = tcu::CommandLine::getBaseSeed(((this->m_caseCtx).testContext)->m_cmdLine);
  local_4f0 = pFVar27;
  generateInputs<vkt::shaderexecutor::InTypes<tcu::Vector<float,3>,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>
            (&local_278,(shaderexecutor *)this_00,
             (Samplings<vkt::shaderexecutor::InTypes<tcu::Vector<float,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
              *)pFVar27,(FloatFormat *)(ulong)PVar5,(Precision)sVar6,(ulong)(iVar15 + 0xdeadbeef),
             in_stack_fffffffffffffa68);
  pVVar12 = local_278.in0.
            super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
            _M_impl.super__Vector_impl_data._M_start;
  local_568 = ((long)local_278.in0.
                     super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_278.in0.
                     super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555;
  Outputs<vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_3,_3>,_tcu::Vector<float,_3>_>_>::Outputs
            (&local_438,local_568);
  local_478 = (this->m_caseCtx).highpFormat.m_maxValue;
  local_498._0_8_ = *(undefined8 *)&(this->m_caseCtx).highpFormat;
  local_498._8_8_ = *(undefined8 *)&(this->m_caseCtx).highpFormat.m_fractionBits;
  local_488 = *(double *)&(this->m_caseCtx).highpFormat.m_hasInf;
  dStack_480 = *(double *)&(this->m_caseCtx).highpFormat.m_exactPrecision;
  local_468._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_468._M_impl.super__Rb_tree_header._M_header;
  local_468._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_468._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_468._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_468._M_impl.super__Rb_tree_header._M_header._M_right =
       local_468._M_impl.super__Rb_tree_header._M_header._M_left;
  tcu::ResultCollector::ResultCollector(&local_1f8);
  local_570 = ((this->super_TestInstance).m_context)->m_testCtx->m_log;
  local_218 = local_278.in0.
              super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
              _M_impl.super__Vector_impl_data._M_start;
  local_210 = local_278.in1.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_208 = local_278.in2.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_200 = local_278.in3.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_288 = local_438.out0.
              super__Vector_base<tcu::Matrix<float,_3,_3>,_std::allocator<tcu::Matrix<float,_3,_3>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_280 = local_438.out1.
              super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
              _M_impl.super__Vector_impl_data._M_start;
  poVar3 = (ostringstream *)(local_408 + 8);
  local_408._0_8_ = local_570;
  std::__cxx11::ostringstream::ostringstream(poVar3);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"Statement: ",0xb);
  std::ostream::_M_insert<bool>(false);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_408,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar3);
  std::ios_base::~ios_base(local_390);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  p_Var4 = (_Rb_tree_node_base *)(local_4e0 + 8);
  local_4e0._8_4_ = _S_red;
  local_4d0._M_allocated_capacity = 0;
  local_4b8 = 0.0;
  pSVar7 = (this->m_stmt).super_SharedPtr<const_vkt::shaderexecutor::Statement>.m_ptr;
  local_4d0._8_8_ = p_Var4;
  local_4c0 = p_Var4;
  (*pSVar7->_vptr_Statement[4])(pSVar7,local_4e0);
  if ((_Rb_tree_node_base *)local_4d0._8_8_ != p_Var4) {
    uVar17 = local_4d0._8_8_;
    do {
      (**(code **)(**(long **)(uVar17 + 0x20) + 0x30))(*(long **)(uVar17 + 0x20),local_1a8);
      uVar17 = std::_Rb_tree_increment((_Rb_tree_node_base *)uVar17);
    } while ((_Rb_tree_node_base *)uVar17 != p_Var4);
  }
  if (local_4b8 != 0.0) {
    poVar3 = (ostringstream *)(local_408 + 8);
    local_408._0_8_ = local_570;
    std::__cxx11::ostringstream::ostringstream(poVar3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar3,"Reference definitions:\n",0x17);
    std::__cxx11::stringbuf::str();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar3,(char *)local_560._0_8_,local_560._8_8_);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_408,(EndMessageToken *)&tcu::TestLog::EndMessage);
    if ((IVal *)local_560._0_8_ != (IVal *)local_550) {
      operator_delete((void *)local_560._0_8_,local_550._0_8_ + 1);
    }
    std::__cxx11::ostringstream::~ostringstream(poVar3);
    std::ios_base::~ios_base(local_390);
  }
  std::
  _Rb_tree<const_vkt::shaderexecutor::FuncBase_*,_const_vkt::shaderexecutor::FuncBase_*,_std::_Identity<const_vkt::shaderexecutor::FuncBase_*>,_std::less<const_vkt::shaderexecutor::FuncBase_*>,_std::allocator<const_vkt::shaderexecutor::FuncBase_*>_>
  ::~_Rb_tree((_Rb_tree<const_vkt::shaderexecutor::FuncBase_*,_const_vkt::shaderexecutor::FuncBase_*,_std::_Identity<const_vkt::shaderexecutor::FuncBase_*>,_std::less<const_vkt::shaderexecutor::FuncBase_*>,_std::allocator<const_vkt::shaderexecutor::FuncBase_*>_>
               *)local_4e0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  pSVar8 = (this->m_executor).
           super_UniqueBase<vkt::shaderexecutor::ShaderExecutor,_de::DefaultDeleter<vkt::shaderexecutor::ShaderExecutor>_>
           .m_data.ptr;
  pBVar30 = this;
  (*pSVar8->_vptr_ShaderExecutor[2])(pSVar8,local_568,&local_218,&local_288,0);
  lVar18 = 8;
  do {
    local_1a8[lVar18 + -8] = 0;
    *(undefined8 *)(local_1a8 + lVar18) = 0x7ff0000000000000;
    *(undefined8 *)(local_1a8 + lVar18 + 8) = 0xfff0000000000000;
    lVar18 = lVar18 + 0x18;
  } while (lVar18 != 0x50);
  lVar18 = 8;
  do {
    local_1a8[lVar18 + -8] = 0;
    *(undefined8 *)(local_1a8 + lVar18) = 0x7ff0000000000000;
    *(undefined8 *)(local_1a8 + lVar18 + 8) = 0xfff0000000000000;
    lVar18 = lVar18 + 0x18;
  } while (lVar18 != 0x50);
  tcu::Matrix<tcu::Interval,_3,_3>::Matrix((Matrix<tcu::Interval,_3,_3> *)local_408);
  lVar18 = 8;
  do {
    *(undefined1 *)((long)&local_4e8 + lVar18) = 0;
    *(undefined8 *)(local_4e0 + lVar18) = 0x7ff0000000000000;
    *(undefined8 *)(local_4e0 + lVar18 + 8) = 0xfff0000000000000;
    lVar18 = lVar18 + 0x18;
  } while (lVar18 != 0x50);
  lVar18 = 8;
  do {
    *(undefined1 *)((long)&local_4e8 + lVar18) = 0;
    *(undefined8 *)(local_4e0 + lVar18) = 0x7ff0000000000000;
    *(undefined8 *)(local_4e0 + lVar18 + 8) = 0xfff0000000000000;
    lVar18 = lVar18 + 0x18;
  } while (lVar18 != 0x50);
  Environment::bind<tcu::Vector<float,3>>
            ((Environment *)&local_468,
             (this->m_variables).in0.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_3>_>_>.m_ptr,
             (IVal *)local_1a8);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_468,
             (this->m_variables).in1.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             (IVal *)local_560);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_468,
             (this->m_variables).in2.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             (IVal *)local_590);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_468,
             (this->m_variables).in3.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             (IVal *)(local_550 + 0x38));
  Environment::bind<tcu::Matrix<float,3,3>>
            ((Environment *)&local_468,
             (this->m_variables).out0.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_3,_3>_>_>.m_ptr,
             (IVal *)local_408);
  Environment::bind<tcu::Vector<float,3>>
            ((Environment *)&local_468,
             (this->m_variables).out1.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_3>_>_>.m_ptr,
             (IVal *)local_4e0);
  if (local_278.in0.
      super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>._M_impl.
      super__Vector_impl_data._M_finish == pVVar12) {
LAB_0093ad1f:
    poVar3 = (ostringstream *)(local_408 + 8);
    local_408._0_8_ = local_570;
    std::__cxx11::ostringstream::ostringstream(poVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"All ",4);
    pTVar28 = local_4e8;
    std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3," inputs passed.",0xf);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_408,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar3);
    std::ios_base::~ios_base(local_390);
    local_408._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)(local_408 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_408,"Pass","");
    pTVar28->m_code = QP_TEST_RESULT_PASS;
    (pTVar28->m_description)._M_dataplus._M_p = (pointer)&(pTVar28->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pTVar28->m_description,local_408._0_8_,
               (char *)(local_408._0_8_ + CONCAT44(local_408._12_4_,local_408._8_4_)));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_408._0_8_ ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_408 + 0x10)) goto LAB_0093af07;
    uVar17 = (_Base_ptr)
             CONCAT44(local_3f8._M_allocated_capacity._4_4_,local_3f8._M_allocated_capacity._0_4_);
    local_4e0._0_8_ = local_408._0_8_;
  }
  else {
    local_470 = local_568 + (local_568 == 0);
    lVar18 = 0;
    local_4f8 = 0.0;
    pFVar27 = local_4f0;
    do {
      tcu::Matrix<tcu::Interval,_3,_3>::Matrix((Matrix<tcu::Interval,_3,_3> *)local_1a8);
      lVar19 = 8;
      do {
        *(undefined1 *)((long)&local_4e8 + lVar19) = 0;
        *(undefined8 *)(local_4e0 + lVar19) = 0x7ff0000000000000;
        *(undefined8 *)(local_4e0 + lVar19 + 8) = 0xfff0000000000000;
        lVar19 = lVar19 + 0x18;
      } while (lVar19 != 0x50);
      lVar19 = 8;
      do {
        *(undefined1 *)((long)&local_4e8 + lVar19) = 0;
        *(undefined8 *)(local_4e0 + lVar19) = 0x7ff0000000000000;
        *(undefined8 *)(local_4e0 + lVar19 + 8) = 0xfff0000000000000;
        lVar19 = lVar19 + 0x18;
      } while (lVar19 != 0x50);
      local_590._8_4_ =
           local_278.in0.
           super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
           _M_impl.super__Vector_impl_data._M_start[lVar18].m_data[2];
      local_590._0_8_ =
           *(undefined8 *)
            local_278.in0.
            super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
            _M_impl.super__Vector_impl_data._M_start[lVar18].m_data;
      ContainerTraits<tcu::Vector<float,_3>,_tcu::Vector<tcu::Interval,_3>_>::doRound
                ((IVal *)local_560,pFVar27,(Vector<float,_3> *)local_590);
      ContainerTraits<tcu::Vector<float,_3>,_tcu::Vector<tcu::Interval,_3>_>::doConvert
                ((IVal *)local_408,pFVar27,(IVal *)local_560);
      pIVar20 = Environment::lookup<tcu::Vector<float,3>>
                          ((Environment *)&local_468,
                           (pBVar30->m_variables).in0.
                           super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_3>_>_>
                           .m_ptr);
      psVar22 = (string *)local_408;
      for (lVar19 = 9; lVar19 != 0; lVar19 = lVar19 + -1) {
        *(pointer *)pIVar20->m_data = (psVar22->_M_dataplus)._M_p;
        psVar22 = (string *)((long)psVar22 + (ulong)bVar29 * -0x10 + 8);
        pIVar20 = (IVal *)((long)pIVar20 + ((ulong)bVar29 * -2 + 1) * 8);
      }
      pBVar31 = pBVar30;
      Environment::lookup<vkt::shaderexecutor::Void>
                ((Environment *)&local_468,
                 (pBVar30->m_variables).in1.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
                 m_ptr);
      Environment::lookup<vkt::shaderexecutor::Void>
                ((Environment *)&local_468,
                 (pBVar30->m_variables).in2.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
                 m_ptr);
      Environment::lookup<vkt::shaderexecutor::Void>
                ((Environment *)&local_468,
                 (pBVar30->m_variables).in3.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
                 m_ptr);
      local_3e0 = (pBVar30->m_caseCtx).precision;
      local_3e8 = pFVar27->m_maxValue;
      local_408._0_8_ = *(undefined8 *)pFVar27;
      local_408._8_4_ = pFVar27->m_fractionBits;
      local_408._12_4_ = pFVar27->m_hasSubnormal;
      local_3f8._M_allocated_capacity._0_4_ = pFVar27->m_hasInf;
      local_3f8._M_allocated_capacity._4_4_ = pFVar27->m_hasNaN;
      local_3f8._8_1_ = pFVar27->m_exactPrecision;
      local_3f8._9_3_ = *(undefined3 *)&pFVar27->field_0x19;
      local_3f8._12_4_ = *(undefined4 *)&pFVar27->field_0x1c;
      local_3d0 = 0;
      pSVar7 = (pBVar30->m_stmt).super_SharedPtr<const_vkt::shaderexecutor::Statement>.m_ptr;
      local_3d8 = &local_468;
      (*pSVar7->_vptr_Statement[3])(pSVar7,(string *)local_408);
      pIVar20 = Environment::lookup<tcu::Vector<float,3>>
                          ((Environment *)&local_468,
                           (pBVar30->m_variables).out1.
                           super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_3>_>_>
                           .m_ptr);
      ContainerTraits<tcu::Vector<float,_3>,_tcu::Vector<tcu::Interval,_3>_>::doConvert
                ((IVal *)local_408,(FloatFormat *)local_498,pIVar20);
      psVar22 = (string *)local_408;
      pIVar20 = (IVal *)local_4e0;
      for (lVar19 = 9; lVar19 != 0; lVar19 = lVar19 + -1) {
        *(pointer *)pIVar20->m_data = (psVar22->_M_dataplus)._M_p;
        psVar22 = (string *)((long)psVar22 + (ulong)bVar29 * -0x10 + 8);
        pIVar20 = (IVal *)((long)pIVar20 + ((ulong)bVar29 * -2 + 1) * 8);
      }
      bVar13 = ContainerTraits<tcu::Vector<float,_3>,_tcu::Vector<tcu::Interval,_3>_>::doContains
                         ((IVal *)local_4e0,
                          local_438.out1.
                          super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + lVar18);
      local_408._0_8_ = local_408 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_408,"Shader output 1 is outside acceptable range","");
      bVar13 = tcu::ResultCollector::check(&local_1f8,bVar13,(string *)local_408);
      pBVar30 = pBVar31;
      if ((TestLog *)local_408._0_8_ != (TestLog *)(local_408 + 0x10)) {
        operator_delete((void *)local_408._0_8_,
                        CONCAT44(local_3f8._M_allocated_capacity._4_4_,
                                 local_3f8._M_allocated_capacity._0_4_) + 1);
        pBVar30 = pBVar31;
      }
      pIVar21 = Environment::lookup<tcu::Matrix<float,3,3>>
                          ((Environment *)&local_468,
                           (pBVar30->m_variables).out0.
                           super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_3,_3>_>_>
                           .m_ptr);
      ContainerTraits<tcu::Matrix<float,_3,_3>,_tcu::Matrix<tcu::Interval,_3,_3>_>::doConvert
                ((IVal *)local_408,(FloatFormat *)local_498,pIVar21);
      puVar24 = local_1a8;
      lVar19 = 0;
      psVar22 = (string *)local_408;
      do {
        lVar25 = 0;
        do {
          *(undefined8 *)(puVar24 + lVar25 + 0x10) =
               *(undefined8 *)((long)&psVar22->field_2 + lVar25);
          puVar23 = (undefined8 *)((long)&(psVar22->_M_dataplus)._M_p + lVar25);
          uVar17 = puVar23[1];
          *(undefined8 *)(puVar24 + lVar25) = *puVar23;
          *(undefined8 *)((long)(puVar24 + lVar25) + 8) = uVar17;
          lVar25 = lVar25 + 0x48;
        } while (lVar25 != 0xd8);
        lVar19 = lVar19 + 1;
        puVar24 = puVar24 + 0x18;
        psVar22 = (string *)((psVar22->field_2)._M_local_buf + 8);
      } while (lVar19 != 3);
      bVar14 = contains<tcu::Matrix<float,3,3>>
                         ((IVal *)local_1a8,
                          local_438.out0.
                          super__Vector_base<tcu::Matrix<float,_3,_3>,_std::allocator<tcu::Matrix<float,_3,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + lVar18);
      local_408._0_8_ = local_408 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_408,"Shader output 0 is outside acceptable range","");
      bVar14 = tcu::ResultCollector::check(&local_1f8,bVar14,(string *)local_408);
      if ((TestLog *)local_408._0_8_ != (TestLog *)(local_408 + 0x10)) {
        operator_delete((void *)local_408._0_8_,
                        CONCAT44(local_3f8._M_allocated_capacity._4_4_,
                                 local_3f8._M_allocated_capacity._0_4_) + 1);
      }
      pFVar27 = local_4f0;
      if (!bVar13 || !bVar14) {
        uVar16 = SUB84(local_4f8,0) + 1;
        local_4f8 = (double)(ulong)uVar16;
        poVar3 = (ostringstream *)(local_408 + 8);
        if ((int)uVar16 < 0x65) {
          local_408._0_8_ = local_570;
          std::__cxx11::ostringstream::ostringstream(poVar3);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"Failed",6);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3," sample:\n",9);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"\t",1);
          pVVar9 = (pBVar30->m_variables).in0.
                   super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_3>_>_>.
                   m_ptr;
          val = (Vector<float,_3> *)local_550;
          pcVar10 = (pVVar9->m_name)._M_dataplus._M_p;
          local_560._0_8_ = val;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_560,pcVar10,pcVar10 + (pVVar9->m_name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar3,(char *)local_560._0_8_,local_560._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3," = ",3);
          valueToString<tcu::Vector<float,3>>
                    ((string *)local_590,(shaderexecutor *)local_498,
                     (FloatFormat *)
                     (local_278.in0.
                      super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + lVar18),val);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar3,(char *)local_590._0_8_,CONCAT44(uStack_584,local_590._8_4_))
          ;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_590._0_8_ != &local_580) {
            operator_delete((void *)local_590._0_8_,local_580._M_allocated_capacity + 1);
          }
          if ((Vector<float,_3> *)local_560._0_8_ != (Vector<float,_3> *)local_550) {
            operator_delete((void *)local_560._0_8_,local_550._0_8_ + 1);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"\t",1);
          pVVar11 = (pBVar30->m_variables).out0.
                    super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_3,_3>_>_>
                    .m_ptr;
          pIVar21 = (IVal *)local_550;
          pcVar10 = (pVVar11->m_name)._M_dataplus._M_p;
          local_560._0_8_ = pIVar21;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_560,pcVar10,pcVar10 + (pVVar11->m_name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar3,(char *)local_560._0_8_,local_560._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3," = ",3);
          valueToString<tcu::Matrix<float,3,3>>
                    ((string *)local_590,(shaderexecutor *)local_498,
                     (FloatFormat *)
                     (local_438.out0.
                      super__Vector_base<tcu::Matrix<float,_3,_3>,_std::allocator<tcu::Matrix<float,_3,_3>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + lVar18),
                     (Matrix<float,_3,_3> *)pIVar21);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar3,(char *)local_590._0_8_,CONCAT44(uStack_584,local_590._8_4_))
          ;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar3,"\tExpected range: ",0x11);
          intervalToString<tcu::Matrix<float,3,3>>
                    ((string *)(local_550 + 0x38),(shaderexecutor *)local_498,
                     (FloatFormat *)local_1a8,pIVar21);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar3,local_518._M_dataplus._M_p,local_518._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_518._M_dataplus._M_p != &local_518.field_2) {
            operator_delete(local_518._M_dataplus._M_p,local_518.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_590._0_8_ != &local_580) {
            operator_delete((void *)local_590._0_8_,local_580._M_allocated_capacity + 1);
          }
          if ((IVal *)local_560._0_8_ != (IVal *)local_550) {
            operator_delete((void *)local_560._0_8_,local_550._0_8_ + 1);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"\t",1);
          pVVar9 = (pBVar30->m_variables).out1.
                   super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_3>_>_>.
                   m_ptr;
          pIVar20 = (IVal *)local_550;
          pcVar10 = (pVVar9->m_name)._M_dataplus._M_p;
          local_560._0_8_ = pIVar20;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_560,pcVar10,pcVar10 + (pVVar9->m_name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar3,(char *)local_560._0_8_,local_560._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3," = ",3);
          valueToString<tcu::Vector<float,3>>
                    ((string *)local_590,(shaderexecutor *)local_498,
                     (FloatFormat *)
                     (local_438.out1.
                      super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + lVar18),
                     (Vector<float,_3> *)pIVar20);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar3,(char *)local_590._0_8_,CONCAT44(uStack_584,local_590._8_4_))
          ;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar3,"\tExpected range: ",0x11);
          intervalToString<tcu::Vector<float,3>>
                    ((string *)(local_550 + 0x38),(shaderexecutor *)local_498,
                     (FloatFormat *)local_4e0,pIVar20);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar3,local_518._M_dataplus._M_p,local_518._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_518._M_dataplus._M_p != &local_518.field_2) {
            operator_delete(local_518._M_dataplus._M_p,local_518.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_590._0_8_ != &local_580) {
            operator_delete((void *)local_590._0_8_,local_580._M_allocated_capacity + 1);
          }
          if ((IVal *)local_560._0_8_ != (IVal *)local_550) {
            operator_delete((void *)local_560._0_8_,local_550._0_8_ + 1);
          }
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_408,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream(poVar3);
          std::ios_base::~ios_base(local_390);
        }
      }
      lVar18 = lVar18 + 1;
    } while (lVar18 != local_470);
    iVar15 = SUB84(local_4f8,0);
    if (iVar15 < 0x65) {
      if (iVar15 == 0) goto LAB_0093ad1f;
    }
    else {
      poVar3 = (ostringstream *)(local_408 + 8);
      local_408._0_8_ = local_570;
      std::__cxx11::ostringstream::ostringstream(poVar3);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"(Skipped ",9);
      std::ostream::operator<<(poVar3,iVar15 + -100);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3," messages.)",0xb);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_408,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar3);
      std::ios_base::~ios_base(local_390);
    }
    poVar3 = (ostringstream *)(local_408 + 8);
    local_408._0_8_ = local_570;
    std::__cxx11::ostringstream::ostringstream(poVar3);
    std::ostream::operator<<(poVar3,iVar15);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"/",1);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3," inputs failed.",0xf);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_408,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar3);
    std::ios_base::~ios_base(local_390);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_408);
    std::ostream::operator<<(local_408,iVar15);
    pTVar28 = local_4e8;
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_408);
    std::ios_base::~ios_base(local_398);
    local_408._0_8_ = local_408 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_408," test failed. Check log for the details","");
    p_Var2 = (_Base_ptr)
             (CONCAT44(local_408._12_4_,local_408._8_4_) + CONCAT44(YStack_4d4,local_4e0._8_4_));
    uVar17 = (_Base_ptr)0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4e0._0_8_ != &local_4d0) {
      uVar17 = local_4d0._M_allocated_capacity;
    }
    if ((ulong)uVar17 < p_Var2) {
      p_Var26 = (_Base_ptr)0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_408._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_408 + 0x10)) {
        p_Var26 = (_Base_ptr)
                  CONCAT44(local_3f8._M_allocated_capacity._4_4_,
                           local_3f8._M_allocated_capacity._0_4_);
      }
      if (p_Var26 < p_Var2) goto LAB_0093ad0d;
      puVar23 = (undefined8 *)
                std::__cxx11::string::replace((ulong)local_408,0,(char *)0x0,local_4e0._0_8_);
    }
    else {
LAB_0093ad0d:
      puVar23 = (undefined8 *)std::__cxx11::string::_M_append(local_4e0,local_408._0_8_);
    }
    local_1a8._0_8_ = local_1a8 + 0x10;
    pdVar1 = (double *)(puVar23 + 2);
    if ((double *)*puVar23 == pdVar1) {
      local_1a8._16_8_ = *pdVar1;
      local_1a8._24_4_ = *(undefined4 *)(puVar23 + 3);
      local_1a8._28_4_ = *(undefined4 *)((long)puVar23 + 0x1c);
    }
    else {
      local_1a8._16_8_ = *pdVar1;
      local_1a8._0_8_ = (double *)*puVar23;
    }
    local_1a8._8_8_ = puVar23[1];
    *puVar23 = pdVar1;
    puVar23[1] = 0;
    *(undefined1 *)pdVar1 = 0;
    pTVar28->m_code = QP_TEST_RESULT_FAIL;
    (pTVar28->m_description)._M_dataplus._M_p = (pointer)&(pTVar28->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pTVar28->m_description,local_1a8._0_8_,
               (undefined1 *)(local_1a8._8_8_ + local_1a8._0_8_));
    if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_408._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_408 + 0x10)) {
      operator_delete((void *)local_408._0_8_,
                      CONCAT44(local_3f8._M_allocated_capacity._4_4_,
                               local_3f8._M_allocated_capacity._0_4_) + 1);
    }
    uVar17 = local_4d0._M_allocated_capacity;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4e0._0_8_ == &local_4d0) goto LAB_0093af07;
  }
  operator_delete((void *)local_4e0._0_8_,(ulong)((long)&((_Base_ptr)uVar17)->_M_color + 1));
LAB_0093af07:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8.m_message._M_dataplus._M_p != &local_1f8.m_message.field_2) {
    operator_delete(local_1f8.m_message._M_dataplus._M_p,
                    local_1f8.m_message.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8.m_prefix._M_dataplus._M_p != &local_1f8.m_prefix.field_2) {
    operator_delete(local_1f8.m_prefix._M_dataplus._M_p,
                    local_1f8.m_prefix.field_2._M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  ::~_Rb_tree(&local_468);
  if (local_438.out1.
      super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_438.out1.
                    super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_438.out1.
                          super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_438.out1.
                          super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_438.out0.
      super__Vector_base<tcu::Matrix<float,_3,_3>,_std::allocator<tcu::Matrix<float,_3,_3>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_438.out0.
                    super__Vector_base<tcu::Matrix<float,_3,_3>,_std::allocator<tcu::Matrix<float,_3,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_438.out0.
                          super__Vector_base<tcu::Matrix<float,_3,_3>,_std::allocator<tcu::Matrix<float,_3,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_438.out0.
                          super__Vector_base<tcu::Matrix<float,_3,_3>,_std::allocator<tcu::Matrix<float,_3,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_278.in3.
      super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_278.in3.
                    super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_278.in3.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_278.in3.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_278.in2.
      super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_278.in2.
                    super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_278.in2.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_278.in2.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_278.in1.
      super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_278.in1.
                    super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_278.in1.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_278.in1.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_278.in0.
      super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_278.in0.
                    super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_278.in0.
                          super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_278.in0.
                          super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return pTVar28;
}

Assistant:

tcu::TestStatus BuiltinPrecisionCaseTestInstance<In, Out>::iterate (void)
{
	typedef typename	In::In0		In0;
	typedef typename	In::In1		In1;
	typedef typename	In::In2		In2;
	typedef typename	In::In3		In3;
	typedef typename	Out::Out0	Out0;
	typedef typename	Out::Out1	Out1;

	Inputs<In>			inputs		= generateInputs(m_samplings, m_caseCtx.floatFormat, m_caseCtx.precision, m_caseCtx.numRandoms, 0xdeadbeefu + m_caseCtx.testContext.getCommandLine().getBaseSeed());
	const FloatFormat&	fmt			= m_caseCtx.floatFormat;
	const int			inCount		= numInputs<In>();
	const int			outCount	= numOutputs<Out>();
	const size_t		numValues	= (inCount > 0) ? inputs.in0.size() : 1;
	Outputs<Out>		outputs		(numValues);
	const FloatFormat	highpFmt	= m_caseCtx.highpFormat;
	const int			maxMsgs		= 100;
	int					numErrors	= 0;
	Environment			env;		// Hoisted out of the inner loop for optimization.
	ResultCollector		status;
	TestLog&			testLog		= m_context.getTestContext().getLog();

	const void*			inputArr[]	=
	{
		&inputs.in0.front(), &inputs.in1.front(), &inputs.in2.front(), &inputs.in3.front(),
	};
	void*				outputArr[]	=
	{
		&outputs.out0.front(), &outputs.out1.front(),
	};

	// Print out the statement and its definitions
	testLog << TestLog::Message << "Statement: " << m_stmt << TestLog::EndMessage;
	{
		ostringstream	oss;
		FuncSet			funcs;

		m_stmt->getUsedFuncs(funcs);
		for (FuncSet::const_iterator it = funcs.begin(); it != funcs.end(); ++it)
		{
			(*it)->printDefinition(oss);
		}
		if (!funcs.empty())
			testLog << TestLog::Message << "Reference definitions:\n" << oss.str()
				  << TestLog::EndMessage;
	}

	switch (inCount)
	{
		case 4: DE_ASSERT(inputs.in3.size() == numValues);
		case 3: DE_ASSERT(inputs.in2.size() == numValues);
		case 2: DE_ASSERT(inputs.in1.size() == numValues);
		case 1: DE_ASSERT(inputs.in0.size() == numValues);
		default: break;
	}

	m_executor->execute(int(numValues), inputArr, outputArr);

	// Initialize environment with dummy values so we don't need to bind in inner loop.
	{
		const typename Traits<In0>::IVal		in0;
		const typename Traits<In1>::IVal		in1;
		const typename Traits<In2>::IVal		in2;
		const typename Traits<In3>::IVal		in3;
		const typename Traits<Out0>::IVal		reference0;
		const typename Traits<Out1>::IVal		reference1;

		env.bind(*m_variables.in0, in0);
		env.bind(*m_variables.in1, in1);
		env.bind(*m_variables.in2, in2);
		env.bind(*m_variables.in3, in3);
		env.bind(*m_variables.out0, reference0);
		env.bind(*m_variables.out1, reference1);
	}

	// For each input tuple, compute output reference interval and compare
	// shader output to the reference.
	for (size_t valueNdx = 0; valueNdx < numValues; valueNdx++)
	{
		bool						result		= true;
		typename Traits<Out0>::IVal	reference0;
		typename Traits<Out1>::IVal	reference1;

		env.lookup(*m_variables.in0) = convert<In0>(fmt, round(fmt, inputs.in0[valueNdx]));
		env.lookup(*m_variables.in1) = convert<In1>(fmt, round(fmt, inputs.in1[valueNdx]));
		env.lookup(*m_variables.in2) = convert<In2>(fmt, round(fmt, inputs.in2[valueNdx]));
		env.lookup(*m_variables.in3) = convert<In3>(fmt, round(fmt, inputs.in3[valueNdx]));

		{
			EvalContext	ctx (fmt, m_caseCtx.precision, env);
			m_stmt->execute(ctx);
		}

		switch (outCount)
		{
			case 2:
				reference1 = convert<Out1>(highpFmt, env.lookup(*m_variables.out1));
				if (!status.check(contains(reference1, outputs.out1[valueNdx]),
									"Shader output 1 is outside acceptable range"))
					result = false;
			case 1:
				reference0 = convert<Out0>(highpFmt, env.lookup(*m_variables.out0));
				if (!status.check(contains(reference0, outputs.out0[valueNdx]),
									"Shader output 0 is outside acceptable range"))
					result = false;
			default: break;
		}

		if (!result)
			++numErrors;

		if ((!result && numErrors <= maxMsgs) || GLS_LOG_ALL_RESULTS)
		{
			MessageBuilder	builder	= testLog.message();

			builder << (result ? "Passed" : "Failed") << " sample:\n";

			if (inCount > 0)
			{
				builder << "\t" << m_variables.in0->getName() << " = "
						<< valueToString(highpFmt, inputs.in0[valueNdx]) << "\n";
			}

			if (inCount > 1)
			{
				builder << "\t" << m_variables.in1->getName() << " = "
						<< valueToString(highpFmt, inputs.in1[valueNdx]) << "\n";
			}

			if (inCount > 2)
			{
				builder << "\t" << m_variables.in2->getName() << " = "
						<< valueToString(highpFmt, inputs.in2[valueNdx]) << "\n";
			}

			if (inCount > 3)
			{
				builder << "\t" << m_variables.in3->getName() << " = "
						<< valueToString(highpFmt, inputs.in3[valueNdx]) << "\n";
			}

			if (outCount > 0)
			{
				builder << "\t" << m_variables.out0->getName() << " = "
						<< valueToString(highpFmt, outputs.out0[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out0>(highpFmt, reference0) << "\n";
			}

			if (outCount > 1)
			{
				builder << "\t" << m_variables.out1->getName() << " = "
						<< valueToString(highpFmt, outputs.out1[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out1>(highpFmt, reference1) << "\n";
			}

			builder << TestLog::EndMessage;
		}
	}

	if (numErrors > maxMsgs)
	{
		testLog << TestLog::Message << "(Skipped " << (numErrors - maxMsgs) << " messages.)"
			  << TestLog::EndMessage;
	}

	if (numErrors == 0)
	{
		testLog << TestLog::Message << "All " << numValues << " inputs passed."
			  << TestLog::EndMessage;
	}
	else
	{
		testLog << TestLog::Message << numErrors << "/" << numValues << " inputs failed."
			  << TestLog::EndMessage;
	}

	if (numErrors)
		return tcu::TestStatus::fail(de::toString(numErrors) + string(" test failed. Check log for the details"));
	else
		return tcu::TestStatus::pass("Pass");

}